

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

BaseNode * __thiscall
asmjit::_abi_1_10::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  NodeFlags *pNVar1;
  NodeFlags NVar2;
  BaseNode *pBVar3;
  BaseNode *pBVar4;
  BaseNode **ppBVar5;
  BaseNode *pBVar6;
  
  if ((node->field_0).field_0._prev == (BaseNode *)0x0) {
    if ((node->field_0).field_0._next != (BaseNode *)0x0) goto LAB_001167a6;
    NVar2 = (node->field_1)._any._nodeFlags;
    if (-1 < (char)NVar2) {
      if ((char)(ref->field_1)._any._nodeFlags < '\0') {
        pBVar3 = (ref->field_0).field_0._prev;
        (node->field_0).field_0._prev = pBVar3;
        (node->field_0).field_0._next = ref;
        (node->field_1)._any._nodeFlags = NVar2 | kIsActive;
        if ((node->field_1)._any._nodeType == kSection) {
          this->_dirtySectionLinks = true;
        }
        (ref->field_0).field_0._prev = node;
        ppBVar5 = &(pBVar3->field_0).field_0._next;
        if (pBVar3 == (BaseNode *)0x0) {
          ppBVar5 = &this->_firstNode;
        }
        *ppBVar5 = node;
        return node;
      }
      goto LAB_001167b0;
    }
  }
  else {
    addBefore();
LAB_001167a6:
    addBefore();
  }
  addBefore();
LAB_001167b0:
  addBefore();
  if ((char)(node->field_1)._any._nodeFlags < '\0') {
    pBVar3 = (node->field_0).field_0._prev;
    pBVar4 = (node->field_0).field_0._next;
    ppBVar5 = &(pBVar3->field_0).field_0._next;
    if (this->_firstNode == node) {
      ppBVar5 = &this->_firstNode;
    }
    *ppBVar5 = pBVar4;
    pBVar6 = (BaseNode *)&this->_lastNode;
    if (this->_lastNode != node) {
      pBVar6 = pBVar4;
    }
    (pBVar6->field_0).field_0._prev = pBVar3;
    (node->field_0).field_0._prev = (BaseNode *)0x0;
    (node->field_0).field_0._next = (BaseNode *)0x0;
    pNVar1 = &(node->field_1)._any._nodeFlags;
    *pNVar1 = *pNVar1 & (kActsAsLabel|kActsAsInst|kHasNoEffect|kIsRemovable|kIsInformative|kIsData|
                        kIsCode);
    if ((node->field_1)._any._nodeType == kSection) {
      this->_dirtySectionLinks = true;
    }
    if (this->_cursor == node) {
      this->_cursor = pBVar3;
      return node;
    }
  }
  return node;
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}